

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O0

void __thiscall
cmTestGenerator::GenerateScriptForConfig
          (cmTestGenerator *this,ostream *os,string *config,Indent indent)

{
  cmLocalGenerator *lg;
  bool bVar1;
  bool bVar2;
  TargetType TVar3;
  cmMakefile *pcVar4;
  cmake *cmakeInstance;
  cmListFileBacktrace *pcVar5;
  size_t sVar6;
  ostream *poVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *argv_00;
  reference pvVar8;
  cmGeneratorTarget *this_00;
  cmTest *this_01;
  cmPropertyMap *this_02;
  pointer this_03;
  string *this_04;
  WrapQuotes wrapQuotes;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  string_view str;
  string_view str_00;
  string_view str_01;
  undefined1 auVar10 [16];
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  cVar11;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  _Var12;
  bool local_492;
  string local_3c8;
  string local_3a8 [32];
  cmGeneratorExpression local_388;
  string local_370;
  reference local_350;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *i;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_1;
  int local_2f4;
  string local_2f0;
  int local_2cc;
  undefined1 local_2c8 [16];
  string local_2b8;
  reference local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin1;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_270;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_260;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range1;
  ulong local_250;
  string local_248;
  allocator<char> local_221;
  string local_220;
  byte local_1fb;
  byte local_1fa;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  undefined1 local_1b0 [8];
  anon_class_40_5_cf5cfc57 addLauncher;
  cmGeneratorTarget *target;
  string exe;
  undefined1 local_128 [8];
  cmList argv;
  string local_e8;
  int local_c8;
  allocator<char> local_c1;
  string local_c0;
  string local_a0 [8];
  string equalSigns;
  bool quote_test_name;
  cmListFileBacktrace local_50;
  undefined1 local_40 [8];
  cmGeneratorExpression ge;
  string *config_local;
  ostream *os_local;
  cmTestGenerator *this_local;
  Indent indent_local;
  
  this->TestGenerated = true;
  ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)config;
  pcVar4 = cmTest::GetMakefile(this->Test);
  cmakeInstance = cmMakefile::GetCMakeInstance(pcVar4);
  pcVar5 = cmTest::GetBacktrace(this->Test);
  cmListFileBacktrace::cmListFileBacktrace(&local_50,pcVar5);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_40,cmakeInstance,&local_50);
  cmListFileBacktrace::~cmListFileBacktrace(&local_50);
  pcVar4 = cmTest::GetMakefile(this->Test);
  cmTest::GetName_abi_cxx11_((string *)((long)&equalSigns.field_2 + 8),this->Test);
  bVar1 = anon_unknown.dwarf_36ccdf::needToQuoteTestName
                    (pcVar4,(string *)((long)&equalSigns.field_2 + 8));
  std::__cxx11::string::~string((string *)(equalSigns.field_2._M_local_buf + 8));
  cmTest::GetName_abi_cxx11_(&local_c0,this->Test);
  sVar6 = anon_unknown.dwarf_36ccdf::countMaxConsecutiveEqualSigns(&local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,sVar6 + 1,'=',&local_c1);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string((string *)&local_c0);
  if (bVar1) {
    local_c8 = indent.Level;
    poVar7 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar7 = std::operator<<(poVar7,"add_test([");
    poVar7 = std::operator<<(poVar7,local_a0);
    poVar7 = std::operator<<(poVar7,"[");
    cmTest::GetName_abi_cxx11_(&local_e8,this->Test);
    poVar7 = std::operator<<(poVar7,(string *)&local_e8);
    poVar7 = std::operator<<(poVar7,"]");
    poVar7 = std::operator<<(poVar7,local_a0);
    std::operator<<(poVar7,"] ");
    std::__cxx11::string::~string((string *)&local_e8);
  }
  else {
    poVar7 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar7 = std::operator<<(poVar7,"add_test(");
    cmTest::GetName_abi_cxx11_
              ((string *)
               &argv.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,this->Test);
    poVar7 = std::operator<<(poVar7,(string *)
                                    &argv.Values.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar7," ");
    std::__cxx11::string::~string
              ((string *)
               &argv.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  argv_00 = cmTest::GetCommand_abi_cxx11_(this->Test);
  _Var9 = ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount;
  EvaluateCommandLineArguments
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&exe.field_2 + 8),this,argv_00,(cmGeneratorExpression *)local_40,
             (string *)
             ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi);
  bVar2 = cmTest::GetCommandExpandLists(this->Test);
  cmList::cmList((cmList *)local_128,(container_type *)((long)&exe.field_2 + 8),(uint)bVar2,Yes);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&exe.field_2 + 8));
  bVar2 = cmList::empty((cmList *)local_128);
  if (bVar2) {
    cmList::emplace_back<>((cmList *)local_128);
  }
  pvVar8 = cmList::operator[][abi_cxx11_((cmList *)local_128,0);
  std::__cxx11::string::string((string *)&target,(string *)pvVar8);
  this_00 = cmLocalGenerator::FindGeneratorTargetToUse(this->LG,(string *)&target);
  if ((this_00 == (cmGeneratorTarget *)0x0) ||
     (TVar3 = cmGeneratorTarget::GetType(this_00), TVar3 != EXECUTABLE)) {
    cmsys::SystemTools::ConvertToUnixSlashes((string *)&target);
  }
  else {
    _Var9._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmGeneratorTarget::GetFullPath
              ((string *)&addLauncher.target,this_00,
               (string *)
               ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi,RuntimeBinaryArtifact,false);
    std::__cxx11::string::operator=((string *)&target,(string *)&addLauncher.target);
    std::__cxx11::string::~string((string *)&addLauncher.target);
    addLauncher.this =
         (cmTestGenerator *)
         ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    addLauncher.config = (string *)local_40;
    local_1b0 = (undefined1  [8])this;
    addLauncher.ge = (cmGeneratorExpression *)os;
    addLauncher.os = (ostream *)this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"TEST_LAUNCHER",&local_1d1);
    GenerateScriptForConfig::anon_class_40_5_cf5cfc57::operator()
              ((anon_class_40_5_cf5cfc57 *)local_1b0,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    this_01 = GetTest(this);
    local_1fa = 0;
    local_1fb = 0;
    bVar2 = cmTest::GetCMP0158IsNew(this_01);
    local_492 = true;
    if (bVar2) {
      pcVar4 = cmLocalGenerator::GetMakefile(this->LG);
      std::allocator<char>::allocator();
      local_1fa = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"CMAKE_CROSSCOMPILING",&local_1f9);
      local_1fb = 1;
      local_492 = cmMakefile::IsOn(pcVar4,&local_1f8);
    }
    if ((local_1fb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    if ((local_1fa & 1) != 0) {
      std::allocator<char>::~allocator(&local_1f9);
    }
    if (local_492 != false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_220,"CROSSCOMPILING_EMULATOR",&local_221);
      GenerateScriptForConfig::anon_class_40_5_cf5cfc57::operator()
                ((anon_class_40_5_cf5cfc57 *)local_1b0,&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      std::allocator<char>::~allocator(&local_221);
    }
  }
  auVar10 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&target);
  str._M_len = auVar10._8_8_;
  __range1 = auVar10._0_8_;
  str._M_str = (char *)0x0;
  local_250 = str._M_len;
  cmOutputConverter::EscapeForCMake_abi_cxx11_
            (&local_248,(cmOutputConverter *)__range1,str,(WrapQuotes)_Var9._M_pi);
  std::operator<<(os,(string *)&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  cVar11 = cmMakeRange<cmList>((cmList *)local_128);
  __begin1 = cVar11.Begin._M_current;
  local_270 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::advance((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&__begin1,1);
  local_260 = &local_270;
  __end1 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::begin(local_260);
  arg = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::end(local_260);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&arg);
    if (!bVar2) break;
    local_298 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    poVar7 = std::operator<<(os," ");
    auVar10 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_298);
    str_00._M_len = auVar10._8_8_;
    str_00._M_str = (char *)0x0;
    local_2c8 = auVar10;
    cmOutputConverter::EscapeForCMake_abi_cxx11_
              (&local_2b8,auVar10._0_8_,str_00,(WrapQuotes)_Var9._M_pi);
    std::operator<<(poVar7,(string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::operator<<(os,")\n");
  if (bVar1) {
    local_2cc = indent.Level;
    poVar7 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar7 = std::operator<<(poVar7,"set_tests_properties([");
    poVar7 = std::operator<<(poVar7,local_a0);
    poVar7 = std::operator<<(poVar7,"[");
    cmTest::GetName_abi_cxx11_(&local_2f0,this->Test);
    poVar7 = std::operator<<(poVar7,(string *)&local_2f0);
    poVar7 = std::operator<<(poVar7,"]");
    poVar7 = std::operator<<(poVar7,local_a0);
    std::operator<<(poVar7,"] PROPERTIES ");
    std::__cxx11::string::~string((string *)&local_2f0);
  }
  else {
    local_2f4 = indent.Level;
    poVar7 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar7 = std::operator<<(poVar7,"set_tests_properties(");
    cmTest::GetName_abi_cxx11_((string *)&__range1_1,this->Test);
    poVar7 = std::operator<<(poVar7,(string *)&__range1_1);
    std::operator<<(poVar7," PROPERTIES ");
    std::__cxx11::string::~string((string *)&__range1_1);
  }
  this_02 = cmTest::GetProperties(this->Test);
  cmPropertyMap::GetList_abi_cxx11_
            ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&__begin1_1,this_02);
  __end1_1 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&__begin1_1);
  i = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)std::
         vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&__begin1_1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&i);
    if (!bVar1) break;
    local_350 = __gnu_cxx::
                __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator*(&__end1_1);
    poVar7 = std::operator<<(os," ");
    poVar7 = std::operator<<(poVar7,(string *)local_350);
    poVar7 = std::operator<<(poVar7," ");
    std::__cxx11::string::string(local_3a8,(string *)&local_350->second);
    cmGeneratorExpression::Parse(&local_388,(string *)local_40);
    this_03 = std::
              unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                            *)&local_388);
    _Var9 = ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
    lg = this->LG;
    std::__cxx11::string::string((string *)&local_3c8);
    wrapQuotes = Wrap;
    this_04 = cmCompiledGeneratorExpression::Evaluate
                        (this_03,lg,(string *)_Var9._M_pi,(cmGeneratorTarget *)0x0,
                         (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_3c8)
    ;
    _Var12 = (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              )std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_04);
    str_01._M_len = _Var12._M_refcount._M_pi;
    str_01._M_str = (char *)0x0;
    local_388.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         = (cmConstStack<cmListFileContext,_cmListFileBacktrace>)
           (cmConstStack<cmListFileContext,_cmListFileBacktrace>)_Var12;
    cmOutputConverter::EscapeForCMake_abi_cxx11_
              (&local_370,(cmOutputConverter *)_Var12._M_ptr,str_01,wrapQuotes);
    std::operator<<(poVar7,(string *)&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)&local_388);
    std::__cxx11::string::~string(local_3a8);
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end1_1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&__begin1_1);
  GenerateInternalProperties(this,os);
  std::operator<<(os,")\n");
  std::__cxx11::string::~string((string *)&target);
  cmList::~cmList((cmList *)local_128);
  std::__cxx11::string::~string(local_a0);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_40);
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptForConfig(std::ostream& os,
                                              const std::string& config,
                                              Indent indent)
{
  this->TestGenerated = true;

  // Set up generator expression evaluation context.
  cmGeneratorExpression ge(*this->Test->GetMakefile()->GetCMakeInstance(),
                           this->Test->GetBacktrace());

  // Determine if policy CMP0110 is set to NEW.
  const bool quote_test_name =
    needToQuoteTestName(*this->Test->GetMakefile(), this->Test->GetName());
  // Determine the number of equal-signs needed for quoting test name with
  // [==[...]==] syntax.
  const std::string equalSigns(
    1 + countMaxConsecutiveEqualSigns(this->Test->GetName()), '=');

  // Start the test command.
  if (quote_test_name) {
    os << indent << "add_test([" << equalSigns << "[" << this->Test->GetName()
       << "]" << equalSigns << "] ";
  } else {
    os << indent << "add_test(" << this->Test->GetName() << " ";
  }

  // Evaluate command line arguments
  cmList argv{
    this->EvaluateCommandLineArguments(this->Test->GetCommand(), ge, config),
    // Expand arguments if COMMAND_EXPAND_LISTS is set
    this->Test->GetCommandExpandLists() ? cmList::ExpandElements::Yes
                                        : cmList::ExpandElements::No,
    cmList::EmptyElements::Yes
  };
  // Expanding lists on an empty command may have left it empty
  if (argv.empty()) {
    argv.emplace_back();
  }

  // Check whether the command executable is a target whose name is to
  // be translated.
  std::string exe = argv[0];
  cmGeneratorTarget* target = this->LG->FindGeneratorTargetToUse(exe);
  if (target && target->GetType() == cmStateEnums::EXECUTABLE) {
    // Use the target file on disk.
    exe = target->GetFullPath(config);

    auto addLauncher = [this, &config, &ge, &os,
                        target](std::string const& propertyName) {
      cmValue launcher = target->GetProperty(propertyName);
      if (!cmNonempty(launcher)) {
        return;
      }
      cmList launcherWithArgs{ ge.Parse(*launcher)->Evaluate(this->LG,
                                                             config) };
      if (!launcherWithArgs.empty() && !launcherWithArgs[0].empty()) {
        std::string launcherExe(launcherWithArgs[0]);
        cmSystemTools::ConvertToUnixSlashes(launcherExe);
        os << cmOutputConverter::EscapeForCMake(launcherExe) << " ";
        for (std::string const& arg :
             cmMakeRange(launcherWithArgs).advance(1)) {
          os << cmOutputConverter::EscapeForCMake(arg) << " ";
        }
      }
    };

    // Prepend with the test launcher if specified.
    addLauncher("TEST_LAUNCHER");

    // Prepend with the emulator when cross compiling if required.
    if (!this->GetTest()->GetCMP0158IsNew() ||
        this->LG->GetMakefile()->IsOn("CMAKE_CROSSCOMPILING")) {
      addLauncher("CROSSCOMPILING_EMULATOR");
    }
  } else {
    // Use the command name given.
    cmSystemTools::ConvertToUnixSlashes(exe);
  }

  // Generate the command line with full escapes.
  os << cmOutputConverter::EscapeForCMake(exe);

  for (auto const& arg : cmMakeRange(argv).advance(1)) {
    os << " " << cmOutputConverter::EscapeForCMake(arg);
  }

  // Finish the test command.
  os << ")\n";

  // Output properties for the test.
  if (quote_test_name) {
    os << indent << "set_tests_properties([" << equalSigns << "["
       << this->Test->GetName() << "]" << equalSigns << "] PROPERTIES ";
  } else {
    os << indent << "set_tests_properties(" << this->Test->GetName()
       << " PROPERTIES ";
  }
  for (auto const& i : this->Test->GetProperties().GetList()) {
    os << " " << i.first << " "
       << cmOutputConverter::EscapeForCMake(
            ge.Parse(i.second)->Evaluate(this->LG, config));
  }
  this->GenerateInternalProperties(os);
  os << ")\n";
}